

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.cc
# Opt level: O2

bool __thiscall anon_unknown.dwarf_3d5b::Reactor::arrayItem(Reactor *this,JSON *value)

{
  bool bVar1;
  char *j;
  string n;
  string local_28;
  
  j = "array item: ";
  std::operator<<((ostream *)&std::cout,"array item: ");
  printItem((Reactor *)value,(JSON *)j);
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  bVar1 = JSON::getString(value,&local_28);
  if (bVar1) {
    bVar1 = std::operator==(&local_28,"keep");
    if (bVar1) {
      bVar1 = false;
      goto LAB_0011b2e8;
    }
  }
  bVar1 = true;
LAB_0011b2e8:
  std::__cxx11::string::~string((string *)&local_28);
  return bVar1;
}

Assistant:

bool
Reactor::arrayItem(JSON const& value)
{
    std::cout << "array item: ";
    printItem(value);
    std::string n;
    if (value.getString(n) && n == "keep") {
        return false;
    }
    return true;
}